

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

void __thiscall CMU462::HalfedgeMesh::triangulate(HalfedgeMesh *this)

{
  FaceIter f;
  
  f._M_node = (_List_node_base *)&this->faces;
  while (f._M_node = (f._M_node)->_M_next, f._M_node != (_List_node_base *)&this->faces) {
    splitPolygon(this,f);
  }
  return;
}

Assistant:

void HalfedgeMesh::triangulate() {
  for (FaceIter f = facesBegin(); f != facesEnd(); f++) {
    splitPolygon(f);
  }
}